

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_schema_sort(lyd_node *sibling,int recursive)

{
  int iVar1;
  long *__base;
  lys_module *plVar2;
  lys_module *plVar3;
  lys_node *plVar4;
  bool bVar5;
  lyd_node_pos *array;
  lys_node *first_ssibling;
  lyd_node *node;
  uint local_20;
  uint32_t i;
  uint32_t len;
  int recursive_local;
  lyd_node *sibling_local;
  
  array = (lyd_node_pos *)0x0;
  if (sibling == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_schema_sort");
    sibling_local._4_4_ = -1;
  }
  else {
    _len = (lys_node *)sibling;
    if (sibling->prev != sibling) {
      _len = (lys_node *)lyd_first_sibling(sibling);
      local_20 = 0;
      for (first_ssibling = _len; first_ssibling != (lys_node *)0x0;
          first_ssibling = *(lys_node **)&first_ssibling->flags) {
        local_20 = local_20 + 1;
      }
      __base = (long *)malloc((ulong)local_20 << 4);
      if (__base == (long *)0x0) {
        ly_log(((lys_node *)_len->name)->module->ctx,LY_LLERR,LY_EMEM,
               "Memory allocation failed (%s()).","lyd_schema_sort");
        return -1;
      }
      first_ssibling = _len;
      for (node._4_4_ = 0; node._4_4_ < local_20; node._4_4_ = node._4_4_ + 1) {
        *(undefined4 *)(__base + (ulong)node._4_4_ * 2 + 1) = 0;
        if (array == (lyd_node_pos *)0x0) {
LAB_0019c722:
          array = (lyd_node_pos *)first_ssibling->name;
          while( true ) {
            plVar4 = lys_parent((lys_node *)array);
            bVar5 = false;
            if (plVar4 != (lys_node *)0x0) {
              plVar4 = lys_parent((lys_node *)array);
              bVar5 = (plVar4->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN;
            }
            if (!bVar5) break;
            array = (lyd_node_pos *)lys_parent((lys_node *)array);
          }
          plVar4 = lys_parent((lys_node *)array);
          if (plVar4 == (lys_node *)0x0) {
            while (*(long *)(*(long *)&array[5].pos + 0x50) != 0) {
              array = *(lyd_node_pos **)&array[5].pos;
            }
          }
          else {
            plVar4 = lys_parent((lys_node *)array);
            array = (lyd_node_pos *)plVar4->child;
          }
        }
        else {
          plVar2 = lyd_node_module((lyd_node *)first_ssibling);
          plVar3 = lys_node_module((lys_node *)array);
          if (plVar2 != plVar3) goto LAB_0019c722;
        }
        iVar1 = lys_module_node_pos_r
                          ((lys_node *)array,(lys_node *)first_ssibling->name,
                           (uint32_t *)(__base + (ulong)node._4_4_ * 2 + 1));
        if (iVar1 != 0) {
          free(__base);
          return -1;
        }
        __base[(ulong)node._4_4_ * 2] = (long)first_ssibling;
        first_ssibling = *(lys_node **)&first_ssibling->flags;
      }
      qsort(__base,(ulong)local_20,0x10,lyd_node_pos_cmp);
      for (node._4_4_ = 0; node._4_4_ < local_20; node._4_4_ = node._4_4_ + 1) {
        if ((node._4_4_ == 0) && (_len = (lys_node *)*__base, *(long *)(*__base + 0x28) != 0)) {
          *(long *)(*(long *)(*__base + 0x28) + 0x40) = *__base;
        }
        if (node._4_4_ == 0) {
          *(long *)(*__base + 0x20) = __base[(ulong)(local_20 - 1) * 2];
        }
        else {
          *(long *)(__base[(ulong)node._4_4_ * 2] + 0x20) = __base[(ulong)(node._4_4_ - 1) * 2];
        }
        if (node._4_4_ < local_20 - 1) {
          *(long *)(__base[(ulong)node._4_4_ * 2] + 0x18) = __base[(ulong)(node._4_4_ + 1) * 2];
        }
        else {
          *(undefined8 *)(__base[(ulong)node._4_4_ * 2] + 0x18) = 0;
        }
      }
      free(__base);
    }
    if (recursive != 0) {
      for (first_ssibling = _len; first_ssibling != (lys_node *)0x0;
          first_ssibling = *(lys_node **)&first_ssibling->flags) {
        if ((((*(uint *)(first_ssibling->name + 0x38) & 0x4191) != 0) &&
            (first_ssibling->parent != (lys_node *)0x0)) &&
           (iVar1 = lyd_schema_sort((lyd_node *)first_ssibling->parent,recursive), iVar1 != 0)) {
          return -1;
        }
      }
    }
    sibling_local._4_4_ = 0;
  }
  return sibling_local._4_4_;
}

Assistant:

API int
lyd_schema_sort(struct lyd_node *sibling, int recursive)
{
    uint32_t len, i;
    struct lyd_node *node;
    struct lys_node *first_ssibling = NULL;
    struct lyd_node_pos *array;

    if (!sibling) {
        LOGARG;
        return -1;
    }

    /* something actually to sort */
    if (sibling->prev != sibling) {

        /* find the beginning */
        sibling = lyd_first_sibling(sibling);

        /* count siblings */
        len = 0;
        for (node = sibling; node; node = node->next) {
            ++len;
        }

        array = malloc(len * sizeof *array);
        LY_CHECK_ERR_RETURN(!array, LOGMEM(sibling->schema->module->ctx), -1);

        /* fill arrays with positions and corresponding nodes */
        for (i = 0, node = sibling; i < len; ++i, node = node->next) {
            array[i].pos = 0;

            /* we need to repeat this for every module */
            if (!first_ssibling || (lyd_node_module(node) != lys_node_module(first_ssibling))) {
                /* find the data node schema parent */
                first_ssibling = node->schema;
                while (lys_parent(first_ssibling)
                        && (lys_parent(first_ssibling)->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES))) {
                    first_ssibling = lys_parent(first_ssibling);
                }

                /* find the beginning */
                if (lys_parent(first_ssibling)) {
                    first_ssibling = lys_parent(first_ssibling)->child;
                } else {
                    while (first_ssibling->prev->next) {
                        first_ssibling = first_ssibling->prev;
                    }
                }
            }

            if (lys_module_node_pos_r(first_ssibling, node->schema, &array[i].pos)) {
                free(array);
                return -1;
            }

            array[i].node = node;
        }

        /* sort the arrays */
        qsort(array, len, sizeof *array, lyd_node_pos_cmp);

        /* adjust siblings based on the sorted array */
        for (i = 0; i < len; ++i) {
            /* parent child */
            if (i == 0) {
                /* adjust sibling so that it still points to the beginning */
                sibling = array[i].node;
                if (array[i].node->parent) {
                    array[i].node->parent->child = array[i].node;
                }
            }

            /* prev */
            if (i > 0) {
                array[i].node->prev = array[i - 1].node;
            } else {
                array[i].node->prev = array[len - 1].node;
            }

            /* next */
            if (i < len - 1) {
                array[i].node->next = array[i + 1].node;
            } else {
                array[i].node->next = NULL;
            }
        }
        free(array);
    }

    /* sort all the children recursively */
    if (recursive) {
        LY_TREE_FOR(sibling, node) {
            if ((node->schema->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_RPC | LYS_ACTION | LYS_NOTIF))
                    && node->child && lyd_schema_sort(node->child, recursive)) {
                return -1;
            }
        }
    }

    return EXIT_SUCCESS;
}